

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryReader::BinaryRegistryReader
          (BinaryRegistryReader *this,Archive *archive,string *srcPath)

{
  string *srcPath_local;
  Archive *archive_local;
  BinaryRegistryReader *this_local;
  
  this->m_archive = archive;
  std::__cxx11::string::string((string *)&this->m_srcPath,(string *)srcPath);
  de::details::
  MovePtr<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
  ::MovePtr(&this->m_binaryIndex);
  return;
}

Assistant:

BinaryRegistryReader::BinaryRegistryReader (const tcu::Archive& archive, const std::string& srcPath)
	: m_archive	(archive)
	, m_srcPath	(srcPath)
{
}